

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

RPCHelpMan * getaddrmaninfo(void)

{
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  RPCMethodImpl fun;
  long lVar1;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  undefined8 in_stack_fffffffffffff938;
  undefined8 in_stack_fffffffffffff940;
  undefined8 in_stack_fffffffffffff948;
  undefined8 in_stack_fffffffffffff950;
  _Manager_type in_stack_fffffffffffff958;
  undefined8 in_stack_fffffffffffff960;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff968;
  pointer in_stack_fffffffffffff978;
  pointer pRVar2;
  pointer in_stack_fffffffffffff980;
  pointer pRVar3;
  pointer in_stack_fffffffffffff988;
  pointer pRVar4;
  undefined8 in_stack_fffffffffffff990;
  pointer pRVar5;
  pointer pRVar6;
  pointer pRVar7;
  undefined8 in_stack_fffffffffffff9b0;
  pointer pRVar8;
  pointer pRVar9;
  pointer pRVar10;
  undefined1 in_stack_fffffffffffff9d0 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_610;
  allocator<char> local_5f1;
  vector<RPCResult,_std::allocator<RPCResult>_> local_5f0;
  allocator<char> local_5d2;
  allocator<char> local_5d1;
  RPCResults local_5d0;
  vector<RPCArg,_std::allocator<RPCArg>_> local_5b8;
  allocator<char> local_59a;
  allocator<char> local_599;
  string local_598;
  string local_578;
  string local_558;
  string local_538;
  string local_518;
  string local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  char *local_4b8;
  size_type local_4b0;
  char local_4a8 [8];
  undefined8 uStack_4a0;
  string local_498 [32];
  string local_478 [32];
  string local_458 [32];
  string local_438 [32];
  string local_418 [32];
  string local_3f8 [32];
  RPCResult local_3d8 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  string local_1e0 [32];
  RPCResult local_1c0;
  string local_138 [32];
  string local_118 [32];
  RPCResult local_f8;
  string local_70 [32];
  string local_50 [32];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"getaddrmaninfo",&local_599);
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,
             "\nProvides information about the node\'s address manager by returning the number of addresses in the `new` and `tried` tables and their sum for all networks.\n"
             ,&local_59a);
  local_5b8.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_5b8.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_5b8.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>(local_118,"",&local_5d1);
  std::__cxx11::string::string<std::allocator<char>>
            (local_138,"json object with network type as keys",&local_5d2);
  std::__cxx11::string::string<std::allocator<char>>(local_1e0,"network",&local_5f1);
  GetNetworkNames_abi_cxx11_(&local_610,false);
  util::
  Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3],util::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3]>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,char_const(&)[3])::_lambda(auto:1_const&)_1_>
            (&local_240,(util *)&local_610,", ");
  std::operator+(&local_220,"the network (",&local_240);
  std::operator+(&local_200,&local_220,", all_networks)");
  std::__cxx11::string::string<std::allocator<char>>
            (local_3f8,"new",(allocator<char> *)&stack0xfffffffffffff9d7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_418,
             "number of addresses in the new table, which represent potential peers the node has discovered but hasn\'t yet successfully connected to."
             ,(allocator<char> *)&stack0xfffffffffffff9d6);
  pRVar8 = (pointer)0x0;
  pRVar9 = (pointer)0x0;
  pRVar10 = (pointer)0x0;
  m_key_name._M_string_length = in_stack_fffffffffffff940;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff938;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff948;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff950;
  description._M_string_length = in_stack_fffffffffffff960;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff958;
  description.field_2 = in_stack_fffffffffffff968;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_fffffffffffff980;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_fffffffffffff978;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffff988;
  RPCResult::RPCResult(local_3d8,NUM,m_key_name,description,inner,SUB81(local_3f8,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_438,"tried",(allocator<char> *)&stack0xfffffffffffff9b7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_458,
             "number of addresses in the tried table, which represent peers the node has successfully connected to in the past."
             ,(allocator<char> *)&stack0xfffffffffffff9b6);
  pRVar5 = (pointer)0x0;
  pRVar6 = (pointer)0x0;
  pRVar7 = (pointer)0x0;
  m_key_name_00._M_string_length = in_stack_fffffffffffff940;
  m_key_name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff938;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff948;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff950;
  description_00._M_string_length = in_stack_fffffffffffff960;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff958;
  description_00.field_2 = in_stack_fffffffffffff968;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff980;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff978;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff988;
  RPCResult::RPCResult(local_3d8 + 1,NUM,m_key_name_00,description_00,inner_00,SUB81(local_438,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_478,"total",(allocator<char> *)&stack0xfffffffffffff997);
  std::__cxx11::string::string<std::allocator<char>>
            (local_498,"total number of addresses in both new/tried tables",
             (allocator<char> *)&stack0xfffffffffffff996);
  pRVar2 = (pointer)0x0;
  pRVar3 = (pointer)0x0;
  pRVar4 = (pointer)0x0;
  m_key_name_01._M_string_length = in_stack_fffffffffffff940;
  m_key_name_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff938;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff948;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffff950;
  description_01._M_string_length = in_stack_fffffffffffff960;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff958;
  description_01.field_2._M_local_buf = in_stack_fffffffffffff968._M_local_buf;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult(local_3d8 + 2,NUM,m_key_name_01,description_01,inner_01,SUB81(local_478,0));
  __l._M_len = 3;
  __l._M_array = local_3d8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff9d8,__l,
             (allocator_type *)&stack0xfffffffffffff977);
  m_key_name_02._M_string_length = in_stack_fffffffffffff940;
  m_key_name_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff938;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_fffffffffffff948;
  m_key_name_02.field_2._8_8_ = in_stack_fffffffffffff950;
  description_02._M_string_length = in_stack_fffffffffffff960;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff958;
  description_02.field_2._M_local_buf = in_stack_fffffffffffff968._M_local_buf;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar3;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar2;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar4;
  RPCResult::RPCResult(&local_1c0,OBJ,m_key_name_02,description_02,inner_02,SUB81(local_1e0,0));
  __l_00._M_len = 1;
  __l_00._M_array = &local_1c0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_5f0,__l_00,(allocator_type *)&stack0xfffffffffffff976);
  m_key_name_03._M_string_length = in_stack_fffffffffffff940;
  m_key_name_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff938;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_fffffffffffff948;
  m_key_name_03.field_2._8_8_ = in_stack_fffffffffffff950;
  description_03._M_string_length = in_stack_fffffffffffff960;
  description_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff958;
  description_03.field_2 = in_stack_fffffffffffff968;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar3;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar2;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar4;
  RPCResult::RPCResult(&local_f8,OBJ_DYN,m_key_name_03,description_03,inner_03,SUB81(local_118,0));
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff940;
  result._0_8_ = in_stack_fffffffffffff938;
  result.m_key_name._M_string_length = in_stack_fffffffffffff948;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff950;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff958;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff960;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffff968;
  result._64_8_ = pRVar2;
  result.m_description._M_dataplus._M_p = (pointer)pRVar3;
  result.m_description._M_string_length = (size_type)pRVar4;
  result.m_description.field_2._M_allocated_capacity = in_stack_fffffffffffff990;
  result.m_description.field_2._8_8_ = pRVar5;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar6;
  result.m_cond._M_string_length = (size_type)pRVar7;
  result.m_cond.field_2._M_allocated_capacity = in_stack_fffffffffffff9b0;
  result.m_cond.field_2._8_8_ = pRVar8;
  RPCResults::RPCResults(&local_5d0,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_518,"getaddrmaninfo",(allocator<char> *)&stack0xfffffffffffff975);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_538,"",(allocator<char> *)&stack0xfffffffffffff974);
  HelpExampleCli(&local_4f8,&local_518,&local_538);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_578,"getaddrmaninfo",(allocator<char> *)&stack0xfffffffffffff973);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_598,"",(allocator<char> *)&stack0xfffffffffffff972);
  HelpExampleRpc(&local_558,&local_578,&local_598);
  std::operator+(&local_4d8,&local_4f8,&local_558);
  local_4b8 = local_4a8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._M_dataplus._M_p == &local_4d8.field_2) {
    uStack_4a0 = local_4d8.field_2._8_8_;
  }
  else {
    local_4b8 = local_4d8._M_dataplus._M_p;
  }
  local_4b0 = local_4d8._M_string_length;
  local_4d8._M_string_length = 0;
  local_4d8.field_2._M_local_buf[0] = '\0';
  description_04._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/net.cpp:1082:9)>
       ::_M_invoke;
  description_04._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/net.cpp:1082:9)>
                ::_M_manager;
  description_04.field_2 = in_stack_fffffffffffff968;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar3;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar2;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar4;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar5;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff990;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar6;
  examples.m_examples._M_string_length = in_stack_fffffffffffff9b0;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar7;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar8;
  examples.m_examples.field_2._8_8_ = pRVar9;
  fun._8_24_ = in_stack_fffffffffffff9d0;
  fun.super__Function_base._M_functor._M_unused._M_object = pRVar10;
  local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_fffffffffffff940,&stack0xfffffffffffff948)),
             description_04,args,results,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffff948);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::__cxx11::string::~string((string *)&local_558);
  std::__cxx11::string::~string((string *)&local_598);
  std::__cxx11::string::~string((string *)&local_578);
  std::__cxx11::string::~string((string *)&local_4f8);
  std::__cxx11::string::~string((string *)&local_538);
  std::__cxx11::string::~string((string *)&local_518);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_5d0.m_results);
  RPCResult::~RPCResult(&local_f8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_5f0);
  RPCResult::~RPCResult(&local_1c0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff9d8);
  lVar1 = 0x110;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_3d8[0].m_type + lVar1));
    lVar1 = lVar1 + -0x88;
  } while (lVar1 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff978);
  std::__cxx11::string::~string(local_498);
  std::__cxx11::string::~string(local_478);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff998);
  std::__cxx11::string::~string(local_458);
  std::__cxx11::string::~string(local_438);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff9b8);
  std::__cxx11::string::~string(local_418);
  std::__cxx11::string::~string(local_3f8);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_240);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_610);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::string::~string(local_138);
  std::__cxx11::string::~string(local_118);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_5b8);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getaddrmaninfo()
{
    return RPCHelpMan{
        "getaddrmaninfo",
        "\nProvides information about the node's address manager by returning the number of "
        "addresses in the `new` and `tried` tables and their sum for all networks.\n",
        {},
        RPCResult{
            RPCResult::Type::OBJ_DYN, "", "json object with network type as keys", {
                {RPCResult::Type::OBJ, "network", "the network (" + Join(GetNetworkNames(), ", ") + ", all_networks)", {
                {RPCResult::Type::NUM, "new", "number of addresses in the new table, which represent potential peers the node has discovered but hasn't yet successfully connected to."},
                {RPCResult::Type::NUM, "tried", "number of addresses in the tried table, which represent peers the node has successfully connected to in the past."},
                {RPCResult::Type::NUM, "total", "total number of addresses in both new/tried tables"},
            }},
        }},
        RPCExamples{HelpExampleCli("getaddrmaninfo", "") + HelpExampleRpc("getaddrmaninfo", "")},
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue {
            AddrMan& addrman = EnsureAnyAddrman(request.context);

            UniValue ret(UniValue::VOBJ);
            for (int n = 0; n < NET_MAX; ++n) {
                enum Network network = static_cast<enum Network>(n);
                if (network == NET_UNROUTABLE || network == NET_INTERNAL) continue;
                UniValue obj(UniValue::VOBJ);
                obj.pushKV("new", addrman.Size(network, true));
                obj.pushKV("tried", addrman.Size(network, false));
                obj.pushKV("total", addrman.Size(network));
                ret.pushKV(GetNetworkName(network), std::move(obj));
            }
            UniValue obj(UniValue::VOBJ);
            obj.pushKV("new", addrman.Size(std::nullopt, true));
            obj.pushKV("tried", addrman.Size(std::nullopt, false));
            obj.pushKV("total", addrman.Size());
            ret.pushKV("all_networks", std::move(obj));
            return ret;
        },
    };
}